

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O0

void map_int_string(void)

{
  initializer_list<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8 [32];
  Assert local_288;
  outputter<std::map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_278;
  stringstream local_270 [8];
  stringstream ss;
  ostream local_260 [378];
  allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e6;
  less<int> local_e5;
  int local_e4 [6];
  int local_cc;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c8;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  iterator local_48;
  size_type local_40;
  undefined1 local_38 [8];
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  s;
  
  local_c8 = &local_c0;
  local_cc = 3;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[7],_true>(local_c8,&local_cc,(char (*) [7])"Klaatu");
  local_c8 = &local_98;
  local_e4[1] = 2;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[7],_true>(local_c8,local_e4 + 1,(char (*) [7])"Barada");
  local_c8 = &local_70;
  local_e4[0] = 1;
  std::
  pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<int,_const_char_(&)[6],_true>(local_c8,local_e4,(char (*) [6])"Nikto");
  local_48 = &local_c0;
  local_40 = 3;
  std::
  allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(&local_e6);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_38,__l,&local_e5,&local_e6);
  std::
  allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator(&local_e6);
  local_2b8 = (pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_48;
  do {
    local_2b8 = local_2b8 + -1;
    std::
    pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_2b8);
  } while (local_2b8 != &local_c0);
  std::__cxx11::stringstream::stringstream(local_270);
  local_278 = UnitTests::
              stream_any<std::map<int,std::__cxx11::string,std::less<int>,std::allocator<std::pair<int_const,std::__cxx11::string>>>>
                        ((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_38);
  UnitTests::stream_any_details::operator<<(local_260,&local_278);
  UnitTests::Assert::Assert
            (&local_288,
             "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
             ,0x8a);
  std::__cxx11::stringstream::str();
  UnitTests::Assert::Equals<char[39],std::__cxx11::string>
            (&local_288,(char (*) [39])"[(1, Nikto), (2, Barada), (3, Klaatu)]",local_2a8);
  std::__cxx11::string::~string((string *)local_2a8);
  std::__cxx11::stringstream::~stringstream(local_270);
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_38);
  return;
}

Assistant:

TEST(map_int_string)
{
    auto s  = std::map<int, std::string>{{3, "Klaatu"}, {2, "Barada"}, {1, "Nikto"}};
    auto ss = std::stringstream{};
    ss << UnitTests::stream_any(s);
    ASSERT_EQUALS("[(1, Nikto), (2, Barada), (3, Klaatu)]", ss.str());
}